

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t set_timefilter_pathname_mbs(archive_match *a,wchar_t timetype,char *path)

{
  int iVar1;
  int *piVar2;
  archive_entry *entry;
  time_t ctime_sec;
  long ctime_nsec;
  time_t mtime_sec;
  long mtime_nsec;
  char *fmt;
  stat_conflict st;
  stat local_c0;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    fmt = "pathname is empty";
    iVar1 = 0x16;
  }
  else {
    iVar1 = stat(path,(stat *)&local_c0);
    if (iVar1 == 0) {
      entry = archive_entry_new();
      if (entry != (archive_entry *)0x0) {
        archive_entry_copy_stat(entry,&local_c0);
        ctime_sec = archive_entry_ctime(entry);
        ctime_nsec = archive_entry_ctime_nsec(entry);
        mtime_sec = archive_entry_mtime(entry);
        mtime_nsec = archive_entry_mtime_nsec(entry);
        archive_entry_free(entry);
        set_timefilter(a,timetype,mtime_sec,mtime_nsec,ctime_sec,ctime_nsec);
        return L'\0';
      }
      archive_set_error(&a->archive,0xc,"No memory");
      (a->archive).state = 0x8000;
      return L'\xffffffe2';
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    fmt = "Failed to stat()";
  }
  archive_set_error(&a->archive,iVar1,fmt);
  return L'\xffffffe7';
}

Assistant:

static int
set_timefilter_pathname_mbs(struct archive_match *a, int timetype,
    const char *path)
{
	struct stat st;

	if (path == NULL || *path == '\0') {
		archive_set_error(&(a->archive), EINVAL, "pathname is empty");
		return (ARCHIVE_FAILED);
	}
	if (la_stat(path, &st) != 0) {
		archive_set_error(&(a->archive), errno, "Failed to stat()");
		return (ARCHIVE_FAILED);
	}
	return (set_timefilter_stat(a, timetype, &st));
}